

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O0

LY_ERR lyplg_type_validate_range
                 (LY_DATA_TYPE basetype,lysc_range *range,int64_t value,char *strval,
                 size_t strval_len,ly_err_item **err)

{
  LY_ERR LVar1;
  char *pcVar2;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar4;
  char *local_c0;
  long local_b8;
  char *local_a8;
  char *local_a0;
  long local_98;
  char *local_88;
  ulong local_80;
  char *eapptag_3;
  char *eapptag_2;
  char *eapptag_1;
  char *eapptag;
  ulong uStack_40;
  ly_bool is_length;
  uint64_t u;
  ly_err_item **err_local;
  size_t strval_len_local;
  char *strval_local;
  int64_t value_local;
  lysc_range *range_local;
  LY_DATA_TYPE basetype_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  *err = (ly_err_item *)0x0;
  uStack_40 = 0;
  do {
    if (range->parts == (lysc_range_part *)0x0) {
      local_80 = 0;
    }
    else {
      local_80 = range->parts[-1].field_1.max_u64;
    }
    if (local_80 <= uStack_40) {
      return LY_SUCCESS;
    }
    uVar3 = (undefined4)strval_len;
    if (basetype < LY_TYPE_DEC64) {
      if ((ulong)value < range->parts[uStack_40].field_0.min_u64) {
        if (range->eapptag == (char *)0x0) {
          local_88 = (char *)0x0;
        }
        else {
          local_88 = strdup(range->eapptag);
        }
        if (range->emsg != (char *)0x0) {
          LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,local_88,"%s",range->emsg);
          return LVar1;
        }
        pcVar2 = "Unsatisfied range - value \"%.*s\" is out of the allowed range.";
        if (basetype == LY_TYPE_BINARY || basetype == LY_TYPE_STRING) {
          pcVar2 = "Unsatisfied length - string \"%.*s\" length is not allowed.";
        }
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,local_88,pcVar2,CONCAT44(uVar4,uVar3)
                           ,strval);
        return LVar1;
      }
      if ((ulong)value <= range->parts[uStack_40].field_1.max_u64) {
        return LY_SUCCESS;
      }
      if (range->parts == (lysc_range_part *)0x0) {
        local_98 = 0;
      }
      else {
        local_98 = range->parts[-1].field_1.max_64;
      }
      if (uStack_40 == local_98 - 1U) {
        if (range->eapptag == (char *)0x0) {
          local_a0 = (char *)0x0;
        }
        else {
          local_a0 = strdup(range->eapptag);
        }
        if (range->emsg != (char *)0x0) {
          LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,local_a0,"%s",range->emsg);
          return LVar1;
        }
        pcVar2 = "Unsatisfied range - value \"%.*s\" is out of the allowed range.";
        if (basetype == LY_TYPE_BINARY || basetype == LY_TYPE_STRING) {
          pcVar2 = "Unsatisfied length - string \"%.*s\" length is not allowed.";
        }
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,local_a0,pcVar2,CONCAT44(uVar4,uVar3)
                           ,strval);
        return LVar1;
      }
    }
    else {
      if (value < range->parts[uStack_40].field_0.min_64) {
        if (range->eapptag == (char *)0x0) {
          local_a8 = (char *)0x0;
        }
        else {
          local_a8 = strdup(range->eapptag);
        }
        if (range->emsg != (char *)0x0) {
          LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,local_a8,"%s",range->emsg);
          return LVar1;
        }
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,local_a8,
                           "Unsatisfied range - value \"%.*s\" is out of the allowed range.",
                           CONCAT44(uVar4,uVar3),strval);
        return LVar1;
      }
      if (value <= range->parts[uStack_40].field_1.max_64) {
        return LY_SUCCESS;
      }
      if (range->parts == (lysc_range_part *)0x0) {
        local_b8 = 0;
      }
      else {
        local_b8 = range->parts[-1].field_1.max_64;
      }
      if (uStack_40 == local_b8 - 1U) {
        if (range->eapptag == (char *)0x0) {
          local_c0 = (char *)0x0;
        }
        else {
          local_c0 = strdup(range->eapptag);
        }
        if (range->emsg == (char *)0x0) {
          range_local._4_4_ =
               ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,local_c0,
                          "Unsatisfied range - value \"%.*s\" is out of the allowed range.",
                          CONCAT44(uVar4,uVar3),strval);
        }
        else {
          range_local._4_4_ =
               ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,local_c0,"%s",range->emsg);
        }
        return range_local._4_4_;
      }
    }
    uStack_40 = uStack_40 + 1;
  } while( true );
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_validate_range(LY_DATA_TYPE basetype, struct lysc_range *range, int64_t value, const char *strval,
        size_t strval_len, struct ly_err_item **err)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool is_length; /* length or range */

    *err = NULL;
    is_length = (basetype == LY_TYPE_BINARY || basetype == LY_TYPE_STRING) ? 1 : 0;

    LY_ARRAY_FOR(range->parts, u) {
        if (basetype < LY_TYPE_DEC64) {
            /* unsigned */
            if ((uint64_t)value < range->parts[u].min_u64) {
                char *eapptag = range->eapptag ? strdup(range->eapptag) : NULL;

                if (range->emsg) {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, "%s", range->emsg);
                } else {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag,
                            is_length ? LY_ERRMSG_NOLENGTH : LY_ERRMSG_NORANGE, (int)strval_len, strval);
                }
            } else if ((uint64_t)value <= range->parts[u].max_u64) {
                /* inside the range */
                return LY_SUCCESS;
            } else if (u == LY_ARRAY_COUNT(range->parts) - 1) {
                /* we have the last range part, so the value is out of bounds */
                char *eapptag = range->eapptag ? strdup(range->eapptag) : NULL;

                if (range->emsg) {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, "%s", range->emsg);
                } else {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag,
                            is_length ? LY_ERRMSG_NOLENGTH : LY_ERRMSG_NORANGE, (int)strval_len, strval);
                }
            }
        } else {
            /* signed */
            if (value < range->parts[u].min_64) {
                char *eapptag = range->eapptag ? strdup(range->eapptag) : NULL;

                if (range->emsg) {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, "%s", range->emsg);
                } else {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, LY_ERRMSG_NORANGE, (int)strval_len, strval);
                }
            } else if (value <= range->parts[u].max_64) {
                /* inside the range */
                return LY_SUCCESS;
            } else if (u == LY_ARRAY_COUNT(range->parts) - 1) {
                /* we have the last range part, so the value is out of bounds */
                char *eapptag = range->eapptag ? strdup(range->eapptag) : NULL;

                if (range->emsg) {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, "%s", range->emsg);
                } else {
                    return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, eapptag, LY_ERRMSG_NORANGE, (int)strval_len, strval);
                }
            }
        }
    }

    return LY_SUCCESS;
}